

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_sysconfig_files.c
# Opt level: O1

ares_status_t
process_config_lines
          (ares_channel_t *channel,char *filename,ares_sysconfig_t *sysconfig,
          ares_sysconfig_line_cb_t cb)

{
  ares_status_t aVar1;
  ares_buf_t *buf;
  
  buf = ares_buf_create();
  if (buf == (ares_buf_t *)0x0) {
    aVar1 = ARES_ENOMEM;
  }
  else {
    aVar1 = ares_buf_load_file(filename,buf);
    if (aVar1 == ARES_SUCCESS) {
      aVar1 = ares_sysconfig_process_buf(channel,sysconfig,buf,cb);
    }
  }
  ares_buf_destroy(buf);
  return aVar1;
}

Assistant:

static ares_status_t process_config_lines(const ares_channel_t    *channel,
                                          const char              *filename,
                                          ares_sysconfig_t        *sysconfig,
                                          ares_sysconfig_line_cb_t cb)
{
  ares_status_t status = ARES_SUCCESS;
  ares_buf_t   *buf    = NULL;

  buf = ares_buf_create();
  if (buf == NULL) {
    status = ARES_ENOMEM;
    goto done;
  }

  status = ares_buf_load_file(filename, buf);
  if (status != ARES_SUCCESS) {
    goto done;
  }

  status = ares_sysconfig_process_buf(channel, sysconfig, buf, cb);

done:
  ares_buf_destroy(buf);

  return status;
}